

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zx7.h
# Opt level: O2

int count_bits(int offset,int len)

{
  int iVar1;
  
  iVar1 = elias_gamma_bits(len + -1);
  return iVar1 + (uint)(0x80 < offset) * 4 + 9;
}

Assistant:

int count_bits(int offset, int len) {
    return 1 + (offset > 128 ? 12 : 8) + elias_gamma_bits(len-1);
}